

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_1.h
# Opt level: O0

bool __thiscall
dlib::
binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
::keep_node_balanced
          (binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
           *this,node **t)

{
  node *pnVar1;
  node **in_RSI;
  binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
  *in_RDI;
  node *tree;
  bool local_1;
  
  pnVar1 = *in_RSI;
  if (pnVar1->balance == '\0') {
    local_1 = false;
  }
  else {
    if (pnVar1->balance == '\x02') {
      if (pnVar1->right->balance < '\0') {
        double_rotate_left(in_RDI,in_RSI);
      }
      else {
        rotate_left(in_RDI,in_RSI);
      }
    }
    else if (pnVar1->balance == -2) {
      if (pnVar1->left->balance < '\x01') {
        rotate_right(in_RDI,in_RSI);
      }
      else {
        double_rotate_right(in_RDI,in_RSI);
      }
    }
    if ((*in_RSI)->balance == '\0') {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool binary_search_tree_kernel_1<domain,range,mem_manager,compare>::
    keep_node_balanced (
        node*& t
    )
    {
        // make a reference to the current node so we don't have to dereference 
        // a pointer a bunch of times
        node& tree = *t;
 
        // if tree does not need to be balanced then return false
        if (tree.balance == 0)
            return false;


        // if tree needs to be rotated left
        if (tree.balance == 2)
        {
            if (tree.right->balance >= 0)
                rotate_left(t);
            else
                double_rotate_left(t);
        }
        // else if the tree needs to be rotated right
        else if (tree.balance == -2)
        {
            if (tree.left->balance <= 0)
                rotate_right(t);
            else
                double_rotate_right(t);
        }
   

        if (t->balance == 0)
            return true;
        else
            return false; 
    }